

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_bitstr.cc
# Opt level: O1

int ASN1_BIT_STRING_set_bit(ASN1_BIT_STRING *a,int n,int value)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  uchar *puVar5;
  byte bVar6;
  byte bVar7;
  int iVar8;
  
  iVar8 = n + 7;
  if (-1 < n) {
    iVar8 = n;
  }
  bVar6 = ~(byte)n & 7;
  bVar7 = (byte)(1 << bVar6);
  if (value == 0) {
    bVar7 = 0;
  }
  if (a == (ASN1_BIT_STRING *)0x0) {
    return 0;
  }
  *(byte *)&a->flags = (byte)a->flags & 0xf0;
  iVar8 = iVar8 >> 3;
  if ((a->length <= iVar8) || (a->data == (uchar *)0x0)) {
    if (value == 0) {
      return 1;
    }
    iVar1 = iVar8 + 1;
    if (a->data == (uchar *)0x0) {
      puVar5 = (uchar *)OPENSSL_malloc((long)iVar1);
    }
    else {
      puVar5 = (uchar *)OPENSSL_realloc(a->data,(long)iVar1);
    }
    if (puVar5 == (uchar *)0x0) {
      return 0;
    }
    iVar2 = a->length;
    if (iVar1 - iVar2 != 0 && iVar2 <= iVar1) {
      memset(puVar5 + iVar2,0,(ulong)(uint)(iVar1 - iVar2));
    }
    a->data = puVar5;
    a->length = iVar1;
  }
  a->data[iVar8] =
       a->data[iVar8] & ((byte)(-2 << bVar6) | (byte)(0xfffffffe >> 0x20 - bVar6)) | bVar7;
  if (0 < a->length) {
    uVar4 = a->length;
    do {
      if (a->data[(ulong)uVar4 - 1] != '\0') {
        return 1;
      }
      a->length = uVar4 - 1;
      bVar3 = 1 < (int)uVar4;
      uVar4 = uVar4 - 1;
    } while (bVar3);
  }
  return 1;
}

Assistant:

int ASN1_BIT_STRING_set_bit(ASN1_BIT_STRING *a, int n, int value) {
  int w, v, iv;
  unsigned char *c;

  w = n / 8;
  v = 1 << (7 - (n & 0x07));
  iv = ~v;
  if (!value) {
    v = 0;
  }

  if (a == NULL) {
    return 0;
  }

  a->flags &= ~(ASN1_STRING_FLAG_BITS_LEFT | 0x07);  // clear, set on write

  if ((a->length < (w + 1)) || (a->data == NULL)) {
    if (!value) {
      return 1;  // Don't need to set
    }
    if (a->data == NULL) {
      c = (unsigned char *)OPENSSL_malloc(w + 1);
    } else {
      c = (unsigned char *)OPENSSL_realloc(a->data, w + 1);
    }
    if (c == NULL) {
      return 0;
    }
    if (w + 1 - a->length > 0) {
      OPENSSL_memset(c + a->length, 0, w + 1 - a->length);
    }
    a->data = c;
    a->length = w + 1;
  }
  a->data[w] = ((a->data[w]) & iv) | v;
  while ((a->length > 0) && (a->data[a->length - 1] == 0)) {
    a->length--;
  }
  return 1;
}